

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char * ssh2_pubkey_openssh_str_internal(char *comment,void *v_pub_blob,int pub_len)

{
  uint uVar1;
  int iVar2;
  char *__s;
  ptrlen pVar3;
  int local_dc;
  size_t local_c8;
  int n;
  char *replacement_str;
  void *local_90;
  undefined1 local_78 [8];
  BinarySource src [1];
  char *pcStack_48;
  int i;
  char *p;
  char *buffer;
  ptrlen alg;
  uchar *ssh2blob;
  int pub_len_local;
  void *v_pub_blob_local;
  char *comment_local;
  
  pVar3 = make_ptrlen(v_pub_blob,(long)pub_len);
  BinarySource_INIT__((BinarySource *)local_78,pVar3);
  pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
  replacement_str = (char *)pVar3.ptr;
  buffer = replacement_str;
  local_90 = (void *)pVar3.len;
  alg.ptr = local_90;
  if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
    buffer = "INVALID-ALGORITHM";
    alg.ptr = (void *)strlen("INVALID-ALGORITHM");
  }
  if (comment == (char *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = strlen(comment);
  }
  __s = (char *)safemalloc((long)alg.ptr + local_c8 + (long)((pub_len + 2) / 3 << 2) + 3,1,0);
  uVar1 = string_length_for_printf((size_t)alg.ptr);
  iVar2 = sprintf(__s,"%.*s ",(ulong)uVar1,buffer);
  pcStack_48 = __s + iVar2;
  for (src[0].binarysource_._4_4_ = 0; src[0].binarysource_._4_4_ < pub_len;
      src[0].binarysource_._4_4_ = local_dc + src[0].binarysource_._4_4_) {
    if (pub_len - src[0].binarysource_._4_4_ < 3) {
      local_dc = pub_len - src[0].binarysource_._4_4_;
    }
    else {
      local_dc = 3;
    }
    base64_encode_atom((uchar *)((long)v_pub_blob + (long)src[0].binarysource_._4_4_),local_dc,
                       pcStack_48);
    pcStack_48 = pcStack_48 + 4;
  }
  if (comment == (char *)0x0) {
    *pcStack_48 = '\0';
  }
  else {
    *pcStack_48 = ' ';
    strcpy(pcStack_48 + 1,comment);
  }
  return __s;
}

Assistant:

static char *ssh2_pubkey_openssh_str_internal(const char *comment,
                                              const void *v_pub_blob,
                                              int pub_len)
{
    const unsigned char *ssh2blob = (const unsigned char *)v_pub_blob;
    ptrlen alg;
    char *buffer, *p;
    int i;

    {
        BinarySource src[1];
        BinarySource_BARE_INIT(src, ssh2blob, pub_len);
        alg = get_string(src);
        if (get_err(src)) {
            const char *replacement_str = "INVALID-ALGORITHM";
            alg.ptr = replacement_str;
            alg.len = strlen(replacement_str);
        }
    }

    buffer = snewn(alg.len +
                   4 * ((pub_len+2) / 3) +
                   (comment ? strlen(comment) : 0) + 3, char);
    p = buffer + sprintf(buffer, "%.*s ", PTRLEN_PRINTF(alg));
    i = 0;
    while (i < pub_len) {
        int n = (pub_len - i < 3 ? pub_len - i : 3);
        base64_encode_atom(ssh2blob + i, n, p);
        i += n;
        p += 4;
    }
    if (comment) {
        *p++ = ' ';
        strcpy(p, comment);
    } else
        *p++ = '\0';

    return buffer;
}